

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_math_lang.cpp
# Opt level: O0

Language * Omega_h::math_lang::build_language(void)

{
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_00;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_01;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_02;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_03;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_04;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_05;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_06;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_07;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_08;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_09;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_10;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_11;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_12;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_13;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_14;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_15;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_16;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_17;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_18;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_19;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_20;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_21;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_22;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_23;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_24;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_25;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_26;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_27;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_28;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_29;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_30;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_31;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_32;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_33;
  reference pvVar1;
  reference pvVar2;
  Language *in_RDI;
  string *local_3058;
  string *local_3000;
  string *local_2fa8;
  string *local_2f50;
  string *local_2ec8;
  string *local_2e60;
  string *local_2de8;
  string *local_2da0;
  string *local_2d48;
  string *local_2ca0;
  string *local_2c28;
  string *local_2bb0;
  string *local_2b38;
  string *local_2ac0;
  string *local_2a48;
  string *local_29c0;
  string *local_2948;
  string *local_28d0;
  string *local_2858;
  string *local_27e0;
  string *local_2768;
  string *local_26f0;
  string *local_2678;
  string *local_25d0;
  string *local_2588;
  string *local_2540;
  string *local_24f8;
  string *local_24b0;
  string *local_2468;
  string *local_2420;
  string *local_23d8;
  string *local_2390;
  string *local_2338;
  string *local_22b0;
  string *local_2228;
  allocator local_21ca;
  allocator local_21c9;
  Token local_21c8;
  undefined1 local_2183;
  allocator local_2182;
  allocator local_2181;
  Token local_2180;
  undefined1 local_213b;
  allocator local_213a;
  allocator local_2139;
  Token local_2138;
  undefined1 local_20f3;
  allocator local_20f2;
  allocator local_20f1;
  Token local_20f0;
  undefined1 local_20ab;
  allocator local_20aa;
  allocator local_20a9;
  Token local_20a8;
  undefined1 local_2063;
  allocator local_2062;
  allocator local_2061;
  Token local_2060;
  undefined1 local_201b;
  allocator local_201a;
  allocator local_2019;
  Token local_2018;
  undefined1 local_1fd3;
  allocator local_1fd2;
  allocator local_1fd1;
  Token local_1fd0;
  undefined1 local_1f8b;
  allocator local_1f8a;
  allocator local_1f89;
  Token local_1f88;
  undefined1 local_1f43;
  allocator local_1f42;
  allocator local_1f41;
  Token local_1f40;
  undefined1 local_1efb;
  allocator local_1efa;
  allocator local_1ef9;
  Token local_1ef8;
  undefined1 local_1eb3;
  allocator local_1eb2;
  allocator local_1eb1;
  Token local_1eb0;
  undefined1 local_1e6b;
  allocator local_1e6a;
  allocator local_1e69;
  Token local_1e68;
  undefined1 local_1e23;
  allocator local_1e22;
  allocator local_1e21;
  Token local_1e20;
  undefined1 local_1ddb;
  allocator local_1dda;
  allocator local_1dd9;
  Token local_1dd8;
  undefined1 local_1d93;
  allocator local_1d92;
  allocator local_1d91;
  Token local_1d90;
  undefined1 local_1d4b;
  allocator local_1d4a;
  allocator local_1d49;
  Token local_1d48;
  undefined1 local_1d03;
  allocator local_1d02;
  allocator local_1d01;
  Token local_1d00;
  undefined1 local_1cbb;
  allocator local_1cba;
  allocator local_1cb9;
  Token local_1cb8;
  undefined1 local_1c73;
  allocator local_1c72;
  allocator local_1c71;
  Token local_1c70;
  undefined1 local_1c2b;
  allocator local_1c2a;
  allocator local_1c29;
  Token local_1c28;
  undefined1 local_1be3;
  allocator local_1be2;
  allocator local_1be1;
  Token local_1be0;
  undefined1 local_1b9c;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1b9b;
  undefined1 local_1b9a;
  allocator local_1b99;
  string *local_1b98;
  string local_1b90 [32];
  iterator local_1b70;
  size_type local_1b68;
  allocator local_1b59;
  Production local_1b58;
  allocator local_1b19;
  Production local_1b18;
  undefined1 local_1add;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1adc;
  undefined1 local_1adb;
  allocator local_1ada;
  allocator local_1ad9;
  string *local_1ad8;
  string local_1ad0 [32];
  string local_1ab0 [32];
  iterator local_1a90;
  size_type local_1a88;
  allocator local_1a79;
  Production local_1a78;
  undefined1 local_1a3d;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1a3c;
  undefined1 local_1a3b;
  allocator local_1a3a;
  allocator local_1a39;
  string *local_1a38;
  string local_1a30 [32];
  string local_1a10 [32];
  iterator local_19f0;
  size_type local_19e8;
  allocator local_19d9;
  Production local_19d8;
  undefined1 local_19a0;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_199f;
  undefined1 local_199e;
  allocator local_199d;
  allocator local_199c;
  allocator local_199b;
  allocator local_199a;
  allocator local_1999;
  string *local_1998;
  string local_1990 [32];
  string local_1970 [32];
  string local_1950 [32];
  string local_1930 [32];
  string local_1910 [32];
  iterator local_18f0;
  size_type local_18e8;
  allocator local_18d9;
  Production local_18d8;
  undefined1 local_189e;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_189d;
  undefined1 local_189c;
  allocator local_189b;
  allocator local_189a;
  allocator local_1899;
  string *local_1898;
  string local_1890 [32];
  string local_1870 [32];
  string local_1850 [32];
  iterator local_1830;
  size_type local_1828;
  allocator local_1819;
  Production local_1818;
  undefined1 local_17df;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_17de;
  undefined1 local_17dd;
  allocator local_17dc;
  allocator local_17db;
  allocator local_17da;
  allocator local_17d9;
  string *local_17d8;
  string local_17d0 [32];
  string local_17b0 [32];
  string local_1790 [32];
  string local_1770 [32];
  iterator local_1750;
  size_type local_1748;
  allocator local_1739;
  Production local_1738;
  undefined1 local_16fc;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_16fb;
  undefined1 local_16fa;
  allocator local_16f9;
  string *local_16f8;
  string local_16f0 [32];
  iterator local_16d0;
  size_type local_16c8;
  allocator local_16b9;
  Production local_16b8;
  undefined1 local_167c;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_167b;
  undefined1 local_167a;
  allocator local_1679;
  string *local_1678;
  string local_1670 [32];
  iterator local_1650;
  size_type local_1648;
  allocator local_1639;
  Production local_1638;
  allocator local_15f9;
  Production local_15f8;
  undefined1 local_15ba;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_15b9;
  undefined1 local_15b8;
  allocator local_15b7;
  allocator local_15b6;
  allocator local_15b5;
  allocator local_15b4;
  allocator local_15b3;
  allocator local_15b2;
  allocator local_15b1;
  string *local_15b0;
  string local_15a8 [32];
  string local_1588 [32];
  string local_1568 [32];
  string local_1548 [32];
  string local_1528 [32];
  string local_1508 [32];
  string local_14e8 [32];
  iterator local_14c8;
  size_type local_14c0;
  allocator local_14b1;
  Production local_14b0;
  undefined1 local_1477;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1476;
  undefined1 local_1475;
  allocator local_1474;
  allocator local_1473;
  allocator local_1472;
  allocator local_1471;
  string *local_1470;
  string local_1468 [32];
  string local_1448 [32];
  string local_1428 [32];
  string local_1408 [32];
  iterator local_13e8;
  size_type local_13e0;
  allocator local_13d1;
  Production local_13d0;
  undefined1 local_1397;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1396;
  undefined1 local_1395;
  allocator local_1394;
  allocator local_1393;
  allocator local_1392;
  allocator local_1391;
  string *local_1390;
  string local_1388 [32];
  string local_1368 [32];
  string local_1348 [32];
  string local_1328 [32];
  iterator local_1308;
  size_type local_1300;
  allocator local_12f1;
  Production local_12f0;
  undefined1 local_12b7;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_12b6;
  undefined1 local_12b5;
  allocator local_12b4;
  allocator local_12b3;
  allocator local_12b2;
  allocator local_12b1;
  string *local_12b0;
  string local_12a8 [32];
  string local_1288 [32];
  string local_1268 [32];
  string local_1248 [32];
  iterator local_1228;
  size_type local_1220;
  allocator local_1211;
  Production local_1210;
  undefined1 local_11d7;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_11d6;
  undefined1 local_11d5;
  allocator local_11d4;
  allocator local_11d3;
  allocator local_11d2;
  allocator local_11d1;
  string *local_11d0;
  string local_11c8 [32];
  string local_11a8 [32];
  string local_1188 [32];
  string local_1168 [32];
  iterator local_1148;
  size_type local_1140;
  allocator local_1131;
  Production local_1130;
  undefined1 local_10f7;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_10f6;
  undefined1 local_10f5;
  allocator local_10f4;
  allocator local_10f3;
  allocator local_10f2;
  allocator local_10f1;
  string *local_10f0;
  string local_10e8 [32];
  string local_10c8 [32];
  string local_10a8 [32];
  string local_1088 [32];
  iterator local_1068;
  size_type local_1060;
  allocator local_1051;
  Production local_1050;
  undefined1 local_1018;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1017;
  undefined1 local_1016;
  allocator local_1015;
  allocator local_1014;
  allocator local_1013;
  allocator local_1012;
  allocator local_1011;
  string *local_1010;
  string local_1008 [32];
  string local_fe8 [32];
  string local_fc8 [32];
  string local_fa8 [32];
  string local_f88 [32];
  iterator local_f68;
  size_type local_f60;
  allocator local_f51;
  Production local_f50;
  undefined1 local_f17;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_f16;
  undefined1 local_f15;
  allocator local_f14;
  allocator local_f13;
  allocator local_f12;
  allocator local_f11;
  string *local_f10;
  string local_f08 [32];
  string local_ee8 [32];
  string local_ec8 [32];
  string local_ea8 [32];
  iterator local_e88;
  size_type local_e80;
  allocator local_e71;
  Production local_e70;
  undefined1 local_e37;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_e36;
  undefined1 local_e35;
  allocator local_e34;
  allocator local_e33;
  allocator local_e32;
  allocator local_e31;
  string *local_e30;
  string local_e28 [32];
  string local_e08 [32];
  string local_de8 [32];
  string local_dc8 [32];
  iterator local_da8;
  size_type local_da0;
  allocator local_d91;
  Production local_d90;
  undefined1 local_d57;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_d56;
  undefined1 local_d55;
  allocator local_d54;
  allocator local_d53;
  allocator local_d52;
  allocator local_d51;
  string *local_d50;
  string local_d48 [32];
  string local_d28 [32];
  string local_d08 [32];
  string local_ce8 [32];
  iterator local_cc8;
  size_type local_cc0;
  allocator local_cb1;
  Production local_cb0;
  undefined1 local_c77;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_c76;
  undefined1 local_c75;
  allocator local_c74;
  allocator local_c73;
  allocator local_c72;
  allocator local_c71;
  string *local_c70;
  string local_c68 [32];
  string local_c48 [32];
  string local_c28 [32];
  string local_c08 [32];
  iterator local_be8;
  size_type local_be0;
  allocator local_bd1;
  Production local_bd0;
  undefined1 local_b97;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_b96;
  undefined1 local_b95;
  allocator local_b94;
  allocator local_b93;
  allocator local_b92;
  allocator local_b91;
  string *local_b90;
  string local_b88 [32];
  string local_b68 [32];
  string local_b48 [32];
  string local_b28 [32];
  iterator local_b08;
  size_type local_b00;
  allocator local_af1;
  Production local_af0;
  undefined1 local_ab7;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_ab6;
  undefined1 local_ab5;
  allocator local_ab4;
  allocator local_ab3;
  allocator local_ab2;
  allocator local_ab1;
  string *local_ab0;
  string local_aa8 [32];
  string local_a88 [32];
  string local_a68 [32];
  string local_a48 [32];
  iterator local_a28;
  size_type local_a20;
  allocator local_a11;
  Production local_a10;
  undefined1 local_9d7;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_9d6;
  undefined1 local_9d5;
  allocator local_9d4;
  allocator local_9d3;
  allocator local_9d2;
  allocator local_9d1;
  string *local_9d0;
  string local_9c8 [32];
  string local_9a8 [32];
  string local_988 [32];
  string local_968 [32];
  iterator local_948;
  size_type local_940;
  allocator local_931;
  Production local_930;
  undefined1 local_8f2;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_8f1;
  undefined1 local_8f0;
  allocator local_8ef;
  allocator local_8ee;
  allocator local_8ed;
  allocator local_8ec;
  allocator local_8eb;
  allocator local_8ea;
  allocator local_8e9;
  string *local_8e8;
  string local_8e0 [32];
  string local_8c0 [32];
  string local_8a0 [32];
  string local_880 [32];
  string local_860 [32];
  string local_840 [32];
  string local_820 [32];
  iterator local_800;
  size_type local_7f8;
  allocator local_7e9;
  Production local_7e8;
  undefined1 local_7ac;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_7ab;
  undefined1 local_7aa;
  allocator local_7a9;
  string *local_7a8;
  string local_7a0 [32];
  iterator local_780;
  size_type local_778;
  allocator local_769;
  Production local_768;
  undefined1 local_72c;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_72b;
  undefined1 local_72a;
  allocator local_729;
  string *local_728;
  string local_720 [32];
  iterator local_700;
  size_type local_6f8;
  allocator local_6e9;
  Production local_6e8;
  undefined1 local_6ac;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_6ab;
  undefined1 local_6aa;
  allocator local_6a9;
  string *local_6a8;
  string local_6a0 [32];
  iterator local_680;
  size_type local_678;
  allocator local_669;
  Production local_668;
  undefined1 local_62c;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_62b;
  undefined1 local_62a;
  allocator local_629;
  string *local_628;
  string local_620 [32];
  iterator local_600;
  size_type local_5f8;
  allocator local_5e9;
  Production local_5e8;
  undefined1 local_5ac;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_5ab;
  undefined1 local_5aa;
  allocator local_5a9;
  string *local_5a8;
  string local_5a0 [32];
  iterator local_580;
  size_type local_578;
  allocator local_569;
  Production local_568;
  undefined1 local_52c;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_52b;
  undefined1 local_52a;
  allocator local_529;
  string *local_528;
  string local_520 [32];
  iterator local_500;
  size_type local_4f8;
  allocator local_4e9;
  Production local_4e8;
  undefined1 local_4ac;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_4ab;
  undefined1 local_4aa;
  allocator local_4a9;
  string *local_4a8;
  string local_4a0 [32];
  iterator local_480;
  size_type local_478;
  allocator local_469;
  Production local_468;
  undefined1 local_42c;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_42b;
  undefined1 local_42a;
  allocator local_429;
  string *local_428;
  string local_420 [32];
  iterator local_400;
  size_type local_3f8;
  allocator local_3e9;
  Production local_3e8;
  undefined1 local_3ac;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_3ab;
  undefined1 local_3aa;
  allocator local_3a9;
  string *local_3a8;
  string local_3a0 [32];
  iterator local_380;
  size_type local_378;
  allocator local_369;
  Production local_368;
  allocator local_329;
  Production local_328;
  undefined1 local_2f0;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_2ef;
  undefined1 local_2ee;
  allocator local_2ed;
  allocator local_2ec;
  allocator local_2eb;
  allocator local_2ea;
  allocator local_2e9;
  string *local_2e8;
  string local_2e0 [32];
  string local_2c0 [32];
  string local_2a0 [32];
  string local_280 [32];
  string local_260 [32];
  iterator local_240;
  size_type local_238;
  allocator local_229;
  Production local_228;
  undefined1 local_1ef;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1ee;
  undefined1 local_1ed;
  allocator local_1ec;
  allocator local_1eb;
  allocator local_1ea;
  allocator local_1e9;
  string *local_1e8;
  string local_1e0 [32];
  string local_1c0 [32];
  string local_1a0 [32];
  string local_180 [32];
  iterator local_160;
  size_type local_158;
  allocator local_149;
  Production local_148;
  allocator local_109;
  Production local_108;
  undefined1 local_cd;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_cc;
  undefined1 local_cb;
  allocator local_ca;
  allocator local_c9;
  string *local_c8;
  string local_c0 [32];
  string local_a0 [32];
  iterator local_80;
  size_type local_78;
  allocator local_69;
  Production local_68;
  vector<Omega_h::Language::Production,_std::allocator<Omega_h::Language::Production>_> *local_20;
  vector<Omega_h::Language::Production,_std::allocator<Omega_h::Language::Production>_> *prods;
  Language *out;
  
  prods._7_1_ = 0;
  Language::Language(in_RDI);
  local_20 = &in_RDI->productions;
  std::vector<Omega_h::Language::Production,_std::allocator<Omega_h::Language::Production>_>::resize
            (local_20,0x27);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_68,"program",&local_69);
  local_cd = 1;
  local_cb = 1;
  local_c8 = local_c0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_c0,"statements",&local_c9);
  local_c8 = local_a0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_a0,"expr?",&local_ca);
  local_cb = 0;
  local_80 = (iterator)local_c0;
  local_78 = 2;
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator(&local_cc);
  __l_33._M_len = local_78;
  __l_33._M_array = local_80;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_68.rhs,__l_33,&local_cc);
  local_cd = 0;
  pvVar1 = std::
           vector<Omega_h::Language::Production,_std::allocator<Omega_h::Language::Production>_>::
           operator[](local_20,0);
  Language::Production::operator=(pvVar1,&local_68);
  Language::Production::~Production(&local_68);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator(&local_cc);
  local_2228 = (string *)&local_80;
  do {
    local_2228 = local_2228 + -0x20;
    std::__cxx11::string::~string(local_2228);
  } while (local_2228 != local_c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_ca);
  std::allocator<char>::~allocator((allocator<char> *)&local_c9);
  std::allocator<char>::~allocator((allocator<char> *)&local_69);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_108,"statements",&local_109);
  local_108.rhs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_108.rhs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_108.rhs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_108.rhs);
  pvVar1 = std::
           vector<Omega_h::Language::Production,_std::allocator<Omega_h::Language::Production>_>::
           operator[](local_20,1);
  Language::Production::operator=(pvVar1,&local_108);
  Language::Production::~Production(&local_108);
  std::allocator<char>::~allocator((allocator<char> *)&local_109);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_148,"statements",&local_149);
  local_1ef = 1;
  local_1ed = 1;
  local_1e8 = local_1e0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1e0,"statements",&local_1e9);
  local_1e8 = local_1c0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1c0,"statement",&local_1ea);
  local_1e8 = local_1a0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1a0,";",&local_1eb);
  local_1e8 = local_180;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_180,"S?",&local_1ec);
  local_1ed = 0;
  local_160 = (iterator)local_1e0;
  local_158 = 4;
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator(&local_1ee);
  __l_32._M_len = local_158;
  __l_32._M_array = local_160;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_148.rhs,__l_32,&local_1ee);
  local_1ef = 0;
  pvVar1 = std::
           vector<Omega_h::Language::Production,_std::allocator<Omega_h::Language::Production>_>::
           operator[](local_20,2);
  Language::Production::operator=(pvVar1,&local_148);
  Language::Production::~Production(&local_148);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator(&local_1ee);
  local_22b0 = (string *)&local_160;
  do {
    local_22b0 = local_22b0 + -0x20;
    std::__cxx11::string::~string(local_22b0);
  } while (local_22b0 != local_1e0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1ec);
  std::allocator<char>::~allocator((allocator<char> *)&local_1eb);
  std::allocator<char>::~allocator((allocator<char> *)&local_1ea);
  std::allocator<char>::~allocator((allocator<char> *)&local_1e9);
  std::allocator<char>::~allocator((allocator<char> *)&local_149);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_228,"statement",&local_229);
  local_2f0 = 1;
  local_2ee = 1;
  local_2e8 = local_2e0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2e0,"name",&local_2e9);
  local_2e8 = local_2c0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2c0,"S?",&local_2ea);
  local_2e8 = local_2a0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2a0,"=",&local_2eb);
  local_2e8 = local_280;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_280,"S?",&local_2ec);
  local_2e8 = local_260;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_260,"expr",&local_2ed);
  local_2ee = 0;
  local_240 = (iterator)local_2e0;
  local_238 = 5;
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator(&local_2ef);
  __l_31._M_len = local_238;
  __l_31._M_array = local_240;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_228.rhs,__l_31,&local_2ef);
  local_2f0 = 0;
  pvVar1 = std::
           vector<Omega_h::Language::Production,_std::allocator<Omega_h::Language::Production>_>::
           operator[](local_20,3);
  Language::Production::operator=(pvVar1,&local_228);
  Language::Production::~Production(&local_228);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator(&local_2ef);
  local_2338 = (string *)&local_240;
  do {
    local_2338 = local_2338 + -0x20;
    std::__cxx11::string::~string(local_2338);
  } while (local_2338 != local_2e0);
  std::allocator<char>::~allocator((allocator<char> *)&local_2ed);
  std::allocator<char>::~allocator((allocator<char> *)&local_2ec);
  std::allocator<char>::~allocator((allocator<char> *)&local_2eb);
  std::allocator<char>::~allocator((allocator<char> *)&local_2ea);
  std::allocator<char>::~allocator((allocator<char> *)&local_2e9);
  std::allocator<char>::~allocator((allocator<char> *)&local_229);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_328,"expr?",&local_329);
  local_328.rhs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_328.rhs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_328.rhs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_328.rhs);
  pvVar1 = std::
           vector<Omega_h::Language::Production,_std::allocator<Omega_h::Language::Production>_>::
           operator[](local_20,4);
  Language::Production::operator=(pvVar1,&local_328);
  Language::Production::~Production(&local_328);
  std::allocator<char>::~allocator((allocator<char> *)&local_329);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_368,"expr?",&local_369);
  local_3ac = 1;
  local_3aa = 1;
  local_3a8 = local_3a0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_3a0,"expr",&local_3a9);
  local_3aa = 0;
  local_380 = (iterator)local_3a0;
  local_378 = 1;
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator(&local_3ab);
  __l_30._M_len = local_378;
  __l_30._M_array = local_380;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_368.rhs,__l_30,&local_3ab);
  local_3ac = 0;
  pvVar1 = std::
           vector<Omega_h::Language::Production,_std::allocator<Omega_h::Language::Production>_>::
           operator[](local_20,5);
  Language::Production::operator=(pvVar1,&local_368);
  Language::Production::~Production(&local_368);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator(&local_3ab);
  local_2390 = (string *)&local_380;
  do {
    local_2390 = local_2390 + -0x20;
    std::__cxx11::string::~string(local_2390);
  } while (local_2390 != local_3a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_3a9);
  std::allocator<char>::~allocator((allocator<char> *)&local_369);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_3e8,"expr",&local_3e9);
  local_42c = 1;
  local_42a = 1;
  local_428 = local_420;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_420,"ternary",&local_429);
  local_42a = 0;
  local_400 = (iterator)local_420;
  local_3f8 = 1;
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator(&local_42b);
  __l_29._M_len = local_3f8;
  __l_29._M_array = local_400;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_3e8.rhs,__l_29,&local_42b);
  local_42c = 0;
  pvVar1 = std::
           vector<Omega_h::Language::Production,_std::allocator<Omega_h::Language::Production>_>::
           operator[](local_20,6);
  Language::Production::operator=(pvVar1,&local_3e8);
  Language::Production::~Production(&local_3e8);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator(&local_42b);
  local_23d8 = (string *)&local_400;
  do {
    local_23d8 = local_23d8 + -0x20;
    std::__cxx11::string::~string(local_23d8);
  } while (local_23d8 != local_420);
  std::allocator<char>::~allocator((allocator<char> *)&local_429);
  std::allocator<char>::~allocator((allocator<char> *)&local_3e9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_468,"ternary",&local_469);
  local_4ac = 1;
  local_4aa = 1;
  local_4a8 = local_4a0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_4a0,"add_sub",&local_4a9);
  local_4aa = 0;
  local_480 = (iterator)local_4a0;
  local_478 = 1;
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator(&local_4ab);
  __l_28._M_len = local_478;
  __l_28._M_array = local_480;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_468.rhs,__l_28,&local_4ab);
  local_4ac = 0;
  pvVar1 = std::
           vector<Omega_h::Language::Production,_std::allocator<Omega_h::Language::Production>_>::
           operator[](local_20,7);
  Language::Production::operator=(pvVar1,&local_468);
  Language::Production::~Production(&local_468);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator(&local_4ab);
  local_2420 = (string *)&local_480;
  do {
    local_2420 = local_2420 + -0x20;
    std::__cxx11::string::~string(local_2420);
  } while (local_2420 != local_4a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_4a9);
  std::allocator<char>::~allocator((allocator<char> *)&local_469);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_4e8,"or",&local_4e9);
  local_52c = 1;
  local_52a = 1;
  local_528 = local_520;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_520,"and",&local_529);
  local_52a = 0;
  local_500 = (iterator)local_520;
  local_4f8 = 1;
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator(&local_52b);
  __l_27._M_len = local_4f8;
  __l_27._M_array = local_500;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_4e8.rhs,__l_27,&local_52b);
  local_52c = 0;
  pvVar1 = std::
           vector<Omega_h::Language::Production,_std::allocator<Omega_h::Language::Production>_>::
           operator[](local_20,8);
  Language::Production::operator=(pvVar1,&local_4e8);
  Language::Production::~Production(&local_4e8);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator(&local_52b);
  local_2468 = (string *)&local_500;
  do {
    local_2468 = local_2468 + -0x20;
    std::__cxx11::string::~string(local_2468);
  } while (local_2468 != local_520);
  std::allocator<char>::~allocator((allocator<char> *)&local_529);
  std::allocator<char>::~allocator((allocator<char> *)&local_4e9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_568,"and",&local_569);
  local_5ac = 1;
  local_5aa = 1;
  local_5a8 = local_5a0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_5a0,"comp",&local_5a9);
  local_5aa = 0;
  local_580 = (iterator)local_5a0;
  local_578 = 1;
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator(&local_5ab);
  __l_26._M_len = local_578;
  __l_26._M_array = local_580;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_568.rhs,__l_26,&local_5ab);
  local_5ac = 0;
  pvVar1 = std::
           vector<Omega_h::Language::Production,_std::allocator<Omega_h::Language::Production>_>::
           operator[](local_20,9);
  Language::Production::operator=(pvVar1,&local_568);
  Language::Production::~Production(&local_568);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator(&local_5ab);
  local_24b0 = (string *)&local_580;
  do {
    local_24b0 = local_24b0 + -0x20;
    std::__cxx11::string::~string(local_24b0);
  } while (local_24b0 != local_5a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_5a9);
  std::allocator<char>::~allocator((allocator<char> *)&local_569);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_5e8,"add_sub",&local_5e9);
  local_62c = 1;
  local_62a = 1;
  local_628 = local_620;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_620,"mul_div",&local_629);
  local_62a = 0;
  local_600 = (iterator)local_620;
  local_5f8 = 1;
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator(&local_62b);
  __l_25._M_len = local_5f8;
  __l_25._M_array = local_600;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_5e8.rhs,__l_25,&local_62b);
  local_62c = 0;
  pvVar1 = std::
           vector<Omega_h::Language::Production,_std::allocator<Omega_h::Language::Production>_>::
           operator[](local_20,10);
  Language::Production::operator=(pvVar1,&local_5e8);
  Language::Production::~Production(&local_5e8);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator(&local_62b);
  local_24f8 = (string *)&local_600;
  do {
    local_24f8 = local_24f8 + -0x20;
    std::__cxx11::string::~string(local_24f8);
  } while (local_24f8 != local_620);
  std::allocator<char>::~allocator((allocator<char> *)&local_629);
  std::allocator<char>::~allocator((allocator<char> *)&local_5e9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_668,"mul_div",&local_669);
  local_6ac = 1;
  local_6aa = 1;
  local_6a8 = local_6a0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_6a0,"neg",&local_6a9);
  local_6aa = 0;
  local_680 = (iterator)local_6a0;
  local_678 = 1;
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator(&local_6ab);
  __l_24._M_len = local_678;
  __l_24._M_array = local_680;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_668.rhs,__l_24,&local_6ab);
  local_6ac = 0;
  pvVar1 = std::
           vector<Omega_h::Language::Production,_std::allocator<Omega_h::Language::Production>_>::
           operator[](local_20,0xb);
  Language::Production::operator=(pvVar1,&local_668);
  Language::Production::~Production(&local_668);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator(&local_6ab);
  local_2540 = (string *)&local_680;
  do {
    local_2540 = local_2540 + -0x20;
    std::__cxx11::string::~string(local_2540);
  } while (local_2540 != local_6a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_6a9);
  std::allocator<char>::~allocator((allocator<char> *)&local_669);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_6e8,"neg",&local_6e9);
  local_72c = 1;
  local_72a = 1;
  local_728 = local_720;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_720,"pow",&local_729);
  local_72a = 0;
  local_700 = (iterator)local_720;
  local_6f8 = 1;
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator(&local_72b);
  __l_23._M_len = local_6f8;
  __l_23._M_array = local_700;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_6e8.rhs,__l_23,&local_72b);
  local_72c = 0;
  pvVar1 = std::
           vector<Omega_h::Language::Production,_std::allocator<Omega_h::Language::Production>_>::
           operator[](local_20,0xc);
  Language::Production::operator=(pvVar1,&local_6e8);
  Language::Production::~Production(&local_6e8);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator(&local_72b);
  local_2588 = (string *)&local_700;
  do {
    local_2588 = local_2588 + -0x20;
    std::__cxx11::string::~string(local_2588);
  } while (local_2588 != local_720);
  std::allocator<char>::~allocator((allocator<char> *)&local_729);
  std::allocator<char>::~allocator((allocator<char> *)&local_6e9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_768,"pow",&local_769);
  local_7ac = 1;
  local_7aa = 1;
  local_7a8 = local_7a0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_7a0,"scalar",&local_7a9);
  local_7aa = 0;
  local_780 = (iterator)local_7a0;
  local_778 = 1;
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator(&local_7ab);
  __l_22._M_len = local_778;
  __l_22._M_array = local_780;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_768.rhs,__l_22,&local_7ab);
  local_7ac = 0;
  pvVar1 = std::
           vector<Omega_h::Language::Production,_std::allocator<Omega_h::Language::Production>_>::
           operator[](local_20,0xd);
  Language::Production::operator=(pvVar1,&local_768);
  Language::Production::~Production(&local_768);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator(&local_7ab);
  local_25d0 = (string *)&local_780;
  do {
    local_25d0 = local_25d0 + -0x20;
    std::__cxx11::string::~string(local_25d0);
  } while (local_25d0 != local_7a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_7a9);
  std::allocator<char>::~allocator((allocator<char> *)&local_769);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_7e8,"ternary",&local_7e9);
  local_8f2 = 1;
  local_8f0 = 1;
  local_8e8 = local_8e0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_8e0,"or",&local_8e9);
  local_8e8 = local_8c0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_8c0,"?",&local_8ea);
  local_8e8 = local_8a0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_8a0,"S?",&local_8eb);
  local_8e8 = local_880;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_880,"add_sub",&local_8ec);
  local_8e8 = local_860;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_860,":",&local_8ed);
  local_8e8 = local_840;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_840,"S?",&local_8ee);
  local_8e8 = local_820;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_820,"add_sub",&local_8ef);
  local_8f0 = 0;
  local_800 = (iterator)local_8e0;
  local_7f8 = 7;
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator(&local_8f1);
  __l_21._M_len = local_7f8;
  __l_21._M_array = local_800;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_7e8.rhs,__l_21,&local_8f1);
  local_8f2 = 0;
  pvVar1 = std::
           vector<Omega_h::Language::Production,_std::allocator<Omega_h::Language::Production>_>::
           operator[](local_20,0xe);
  Language::Production::operator=(pvVar1,&local_7e8);
  Language::Production::~Production(&local_7e8);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator(&local_8f1);
  local_2678 = (string *)&local_800;
  do {
    local_2678 = local_2678 + -0x20;
    std::__cxx11::string::~string(local_2678);
  } while (local_2678 != local_8e0);
  std::allocator<char>::~allocator((allocator<char> *)&local_8ef);
  std::allocator<char>::~allocator((allocator<char> *)&local_8ee);
  std::allocator<char>::~allocator((allocator<char> *)&local_8ed);
  std::allocator<char>::~allocator((allocator<char> *)&local_8ec);
  std::allocator<char>::~allocator((allocator<char> *)&local_8eb);
  std::allocator<char>::~allocator((allocator<char> *)&local_8ea);
  std::allocator<char>::~allocator((allocator<char> *)&local_8e9);
  std::allocator<char>::~allocator((allocator<char> *)&local_7e9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_930,"or",&local_931);
  local_9d7 = 1;
  local_9d5 = 1;
  local_9d0 = local_9c8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_9c8,"or",&local_9d1);
  local_9d0 = local_9a8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_9a8,"||",&local_9d2);
  local_9d0 = local_988;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_988,"S?",&local_9d3);
  local_9d0 = local_968;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_968,"and",&local_9d4);
  local_9d5 = 0;
  local_948 = (iterator)local_9c8;
  local_940 = 4;
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator(&local_9d6);
  __l_20._M_len = local_940;
  __l_20._M_array = local_948;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_930.rhs,__l_20,&local_9d6);
  local_9d7 = 0;
  pvVar1 = std::
           vector<Omega_h::Language::Production,_std::allocator<Omega_h::Language::Production>_>::
           operator[](local_20,0xf);
  Language::Production::operator=(pvVar1,&local_930);
  Language::Production::~Production(&local_930);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator(&local_9d6);
  local_26f0 = (string *)&local_948;
  do {
    local_26f0 = local_26f0 + -0x20;
    std::__cxx11::string::~string(local_26f0);
  } while (local_26f0 != local_9c8);
  std::allocator<char>::~allocator((allocator<char> *)&local_9d4);
  std::allocator<char>::~allocator((allocator<char> *)&local_9d3);
  std::allocator<char>::~allocator((allocator<char> *)&local_9d2);
  std::allocator<char>::~allocator((allocator<char> *)&local_9d1);
  std::allocator<char>::~allocator((allocator<char> *)&local_931);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_a10,"and",&local_a11);
  local_ab7 = 1;
  local_ab5 = 1;
  local_ab0 = local_aa8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_aa8,"and",&local_ab1);
  local_ab0 = local_a88;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_a88,"&&",&local_ab2);
  local_ab0 = local_a68;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_a68,"S?",&local_ab3);
  local_ab0 = local_a48;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_a48,"comp",&local_ab4);
  local_ab5 = 0;
  local_a28 = (iterator)local_aa8;
  local_a20 = 4;
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator(&local_ab6);
  __l_19._M_len = local_a20;
  __l_19._M_array = local_a28;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_a10.rhs,__l_19,&local_ab6);
  local_ab7 = 0;
  pvVar1 = std::
           vector<Omega_h::Language::Production,_std::allocator<Omega_h::Language::Production>_>::
           operator[](local_20,0x10);
  Language::Production::operator=(pvVar1,&local_a10);
  Language::Production::~Production(&local_a10);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator(&local_ab6);
  local_2768 = (string *)&local_a28;
  do {
    local_2768 = local_2768 + -0x20;
    std::__cxx11::string::~string(local_2768);
  } while (local_2768 != local_aa8);
  std::allocator<char>::~allocator((allocator<char> *)&local_ab4);
  std::allocator<char>::~allocator((allocator<char> *)&local_ab3);
  std::allocator<char>::~allocator((allocator<char> *)&local_ab2);
  std::allocator<char>::~allocator((allocator<char> *)&local_ab1);
  std::allocator<char>::~allocator((allocator<char> *)&local_a11);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_af0,"comp",&local_af1);
  local_b97 = 1;
  local_b95 = 1;
  local_b90 = local_b88;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_b88,"add_sub",&local_b91);
  local_b90 = local_b68;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_b68,">",&local_b92);
  local_b90 = local_b48;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_b48,"S?",&local_b93);
  local_b90 = local_b28;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_b28,"add_sub",&local_b94);
  local_b95 = 0;
  local_b08 = (iterator)local_b88;
  local_b00 = 4;
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator(&local_b96);
  __l_18._M_len = local_b00;
  __l_18._M_array = local_b08;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_af0.rhs,__l_18,&local_b96);
  local_b97 = 0;
  pvVar1 = std::
           vector<Omega_h::Language::Production,_std::allocator<Omega_h::Language::Production>_>::
           operator[](local_20,0x11);
  Language::Production::operator=(pvVar1,&local_af0);
  Language::Production::~Production(&local_af0);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator(&local_b96);
  local_27e0 = (string *)&local_b08;
  do {
    local_27e0 = local_27e0 + -0x20;
    std::__cxx11::string::~string(local_27e0);
  } while (local_27e0 != local_b88);
  std::allocator<char>::~allocator((allocator<char> *)&local_b94);
  std::allocator<char>::~allocator((allocator<char> *)&local_b93);
  std::allocator<char>::~allocator((allocator<char> *)&local_b92);
  std::allocator<char>::~allocator((allocator<char> *)&local_b91);
  std::allocator<char>::~allocator((allocator<char> *)&local_af1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_bd0,"comp",&local_bd1);
  local_c77 = 1;
  local_c75 = 1;
  local_c70 = local_c68;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_c68,"add_sub",&local_c71);
  local_c70 = local_c48;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_c48,"<",&local_c72);
  local_c70 = local_c28;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_c28,"S?",&local_c73);
  local_c70 = local_c08;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_c08,"add_sub",&local_c74);
  local_c75 = 0;
  local_be8 = (iterator)local_c68;
  local_be0 = 4;
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator(&local_c76);
  __l_17._M_len = local_be0;
  __l_17._M_array = local_be8;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_bd0.rhs,__l_17,&local_c76);
  local_c77 = 0;
  pvVar1 = std::
           vector<Omega_h::Language::Production,_std::allocator<Omega_h::Language::Production>_>::
           operator[](local_20,0x12);
  Language::Production::operator=(pvVar1,&local_bd0);
  Language::Production::~Production(&local_bd0);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator(&local_c76);
  local_2858 = (string *)&local_be8;
  do {
    local_2858 = local_2858 + -0x20;
    std::__cxx11::string::~string(local_2858);
  } while (local_2858 != local_c68);
  std::allocator<char>::~allocator((allocator<char> *)&local_c74);
  std::allocator<char>::~allocator((allocator<char> *)&local_c73);
  std::allocator<char>::~allocator((allocator<char> *)&local_c72);
  std::allocator<char>::~allocator((allocator<char> *)&local_c71);
  std::allocator<char>::~allocator((allocator<char> *)&local_bd1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_cb0,"comp",&local_cb1);
  local_d57 = 1;
  local_d55 = 1;
  local_d50 = local_d48;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_d48,"add_sub",&local_d51);
  local_d50 = local_d28;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_d28,">=",&local_d52);
  local_d50 = local_d08;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_d08,"S?",&local_d53);
  local_d50 = local_ce8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_ce8,"add_sub",&local_d54);
  local_d55 = 0;
  local_cc8 = (iterator)local_d48;
  local_cc0 = 4;
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator(&local_d56);
  __l_16._M_len = local_cc0;
  __l_16._M_array = local_cc8;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_cb0.rhs,__l_16,&local_d56);
  local_d57 = 0;
  pvVar1 = std::
           vector<Omega_h::Language::Production,_std::allocator<Omega_h::Language::Production>_>::
           operator[](local_20,0x13);
  Language::Production::operator=(pvVar1,&local_cb0);
  Language::Production::~Production(&local_cb0);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator(&local_d56);
  local_28d0 = (string *)&local_cc8;
  do {
    local_28d0 = local_28d0 + -0x20;
    std::__cxx11::string::~string(local_28d0);
  } while (local_28d0 != local_d48);
  std::allocator<char>::~allocator((allocator<char> *)&local_d54);
  std::allocator<char>::~allocator((allocator<char> *)&local_d53);
  std::allocator<char>::~allocator((allocator<char> *)&local_d52);
  std::allocator<char>::~allocator((allocator<char> *)&local_d51);
  std::allocator<char>::~allocator((allocator<char> *)&local_cb1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_d90,"comp",&local_d91);
  local_e37 = 1;
  local_e35 = 1;
  local_e30 = local_e28;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_e28,"add_sub",&local_e31);
  local_e30 = local_e08;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_e08,"<=",&local_e32);
  local_e30 = local_de8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_de8,"S?",&local_e33);
  local_e30 = local_dc8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_dc8,"add_sub",&local_e34);
  local_e35 = 0;
  local_da8 = (iterator)local_e28;
  local_da0 = 4;
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator(&local_e36);
  __l_15._M_len = local_da0;
  __l_15._M_array = local_da8;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_d90.rhs,__l_15,&local_e36);
  local_e37 = 0;
  pvVar1 = std::
           vector<Omega_h::Language::Production,_std::allocator<Omega_h::Language::Production>_>::
           operator[](local_20,0x14);
  Language::Production::operator=(pvVar1,&local_d90);
  Language::Production::~Production(&local_d90);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator(&local_e36);
  local_2948 = (string *)&local_da8;
  do {
    local_2948 = local_2948 + -0x20;
    std::__cxx11::string::~string(local_2948);
  } while (local_2948 != local_e28);
  std::allocator<char>::~allocator((allocator<char> *)&local_e34);
  std::allocator<char>::~allocator((allocator<char> *)&local_e33);
  std::allocator<char>::~allocator((allocator<char> *)&local_e32);
  std::allocator<char>::~allocator((allocator<char> *)&local_e31);
  std::allocator<char>::~allocator((allocator<char> *)&local_d91);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_e70,"comp",&local_e71);
  local_f17 = 1;
  local_f15 = 1;
  local_f10 = local_f08;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_f08,"add_sub",&local_f11);
  local_f10 = local_ee8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_ee8,"==",&local_f12);
  local_f10 = local_ec8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_ec8,"S?",&local_f13);
  local_f10 = local_ea8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_ea8,"add_sub",&local_f14);
  local_f15 = 0;
  local_e88 = (iterator)local_f08;
  local_e80 = 4;
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator(&local_f16);
  __l_14._M_len = local_e80;
  __l_14._M_array = local_e88;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_e70.rhs,__l_14,&local_f16);
  local_f17 = 0;
  pvVar1 = std::
           vector<Omega_h::Language::Production,_std::allocator<Omega_h::Language::Production>_>::
           operator[](local_20,0x15);
  Language::Production::operator=(pvVar1,&local_e70);
  Language::Production::~Production(&local_e70);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator(&local_f16);
  local_29c0 = (string *)&local_e88;
  do {
    local_29c0 = local_29c0 + -0x20;
    std::__cxx11::string::~string(local_29c0);
  } while (local_29c0 != local_f08);
  std::allocator<char>::~allocator((allocator<char> *)&local_f14);
  std::allocator<char>::~allocator((allocator<char> *)&local_f13);
  std::allocator<char>::~allocator((allocator<char> *)&local_f12);
  std::allocator<char>::~allocator((allocator<char> *)&local_f11);
  std::allocator<char>::~allocator((allocator<char> *)&local_e71);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_f50,"comp",&local_f51);
  local_1018 = 1;
  local_1016 = 1;
  local_1010 = local_1008;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1008,"(",&local_1011);
  local_1010 = local_fe8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_fe8,"S?",&local_1012);
  local_1010 = local_fc8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_fc8,"or",&local_1013);
  local_1010 = local_fa8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_fa8,")",&local_1014);
  local_1010 = local_f88;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_f88,"S?",&local_1015);
  local_1016 = 0;
  local_f68 = (iterator)local_1008;
  local_f60 = 5;
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator(&local_1017);
  __l_13._M_len = local_f60;
  __l_13._M_array = local_f68;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_f50.rhs,__l_13,&local_1017);
  local_1018 = 0;
  pvVar1 = std::
           vector<Omega_h::Language::Production,_std::allocator<Omega_h::Language::Production>_>::
           operator[](local_20,0x16);
  Language::Production::operator=(pvVar1,&local_f50);
  Language::Production::~Production(&local_f50);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator(&local_1017);
  local_2a48 = (string *)&local_f68;
  do {
    local_2a48 = local_2a48 + -0x20;
    std::__cxx11::string::~string(local_2a48);
  } while (local_2a48 != local_1008);
  std::allocator<char>::~allocator((allocator<char> *)&local_1015);
  std::allocator<char>::~allocator((allocator<char> *)&local_1014);
  std::allocator<char>::~allocator((allocator<char> *)&local_1013);
  std::allocator<char>::~allocator((allocator<char> *)&local_1012);
  std::allocator<char>::~allocator((allocator<char> *)&local_1011);
  std::allocator<char>::~allocator((allocator<char> *)&local_f51);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1050,"add_sub",&local_1051);
  local_10f7 = 1;
  local_10f5 = 1;
  local_10f0 = local_10e8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_10e8,"add_sub",&local_10f1);
  local_10f0 = local_10c8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_10c8,"+",&local_10f2);
  local_10f0 = local_10a8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_10a8,"S?",&local_10f3);
  local_10f0 = local_1088;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1088,"mul_div",&local_10f4);
  local_10f5 = 0;
  local_1068 = (iterator)local_10e8;
  local_1060 = 4;
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator(&local_10f6);
  __l_12._M_len = local_1060;
  __l_12._M_array = local_1068;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_1050.rhs,__l_12,&local_10f6);
  local_10f7 = 0;
  pvVar1 = std::
           vector<Omega_h::Language::Production,_std::allocator<Omega_h::Language::Production>_>::
           operator[](local_20,0x17);
  Language::Production::operator=(pvVar1,&local_1050);
  Language::Production::~Production(&local_1050);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator(&local_10f6);
  local_2ac0 = (string *)&local_1068;
  do {
    local_2ac0 = local_2ac0 + -0x20;
    std::__cxx11::string::~string(local_2ac0);
  } while (local_2ac0 != local_10e8);
  std::allocator<char>::~allocator((allocator<char> *)&local_10f4);
  std::allocator<char>::~allocator((allocator<char> *)&local_10f3);
  std::allocator<char>::~allocator((allocator<char> *)&local_10f2);
  std::allocator<char>::~allocator((allocator<char> *)&local_10f1);
  std::allocator<char>::~allocator((allocator<char> *)&local_1051);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1130,"add_sub",&local_1131);
  local_11d7 = 1;
  local_11d5 = 1;
  local_11d0 = local_11c8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_11c8,"add_sub",&local_11d1);
  local_11d0 = local_11a8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_11a8,"-",&local_11d2);
  local_11d0 = local_1188;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1188,"S?",&local_11d3);
  local_11d0 = local_1168;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1168,"mul_div",&local_11d4);
  local_11d5 = 0;
  local_1148 = (iterator)local_11c8;
  local_1140 = 4;
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator(&local_11d6);
  __l_11._M_len = local_1140;
  __l_11._M_array = local_1148;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_1130.rhs,__l_11,&local_11d6);
  local_11d7 = 0;
  pvVar1 = std::
           vector<Omega_h::Language::Production,_std::allocator<Omega_h::Language::Production>_>::
           operator[](local_20,0x18);
  Language::Production::operator=(pvVar1,&local_1130);
  Language::Production::~Production(&local_1130);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator(&local_11d6);
  local_2b38 = (string *)&local_1148;
  do {
    local_2b38 = local_2b38 + -0x20;
    std::__cxx11::string::~string(local_2b38);
  } while (local_2b38 != local_11c8);
  std::allocator<char>::~allocator((allocator<char> *)&local_11d4);
  std::allocator<char>::~allocator((allocator<char> *)&local_11d3);
  std::allocator<char>::~allocator((allocator<char> *)&local_11d2);
  std::allocator<char>::~allocator((allocator<char> *)&local_11d1);
  std::allocator<char>::~allocator((allocator<char> *)&local_1131);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1210,"mul_div",&local_1211);
  local_12b7 = 1;
  local_12b5 = 1;
  local_12b0 = local_12a8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_12a8,"mul_div",&local_12b1);
  local_12b0 = local_1288;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1288,"*",&local_12b2);
  local_12b0 = local_1268;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1268,"S?",&local_12b3);
  local_12b0 = local_1248;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1248,"pow",&local_12b4);
  local_12b5 = 0;
  local_1228 = (iterator)local_12a8;
  local_1220 = 4;
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator(&local_12b6);
  __l_10._M_len = local_1220;
  __l_10._M_array = local_1228;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_1210.rhs,__l_10,&local_12b6);
  local_12b7 = 0;
  pvVar1 = std::
           vector<Omega_h::Language::Production,_std::allocator<Omega_h::Language::Production>_>::
           operator[](local_20,0x19);
  Language::Production::operator=(pvVar1,&local_1210);
  Language::Production::~Production(&local_1210);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator(&local_12b6);
  local_2bb0 = (string *)&local_1228;
  do {
    local_2bb0 = local_2bb0 + -0x20;
    std::__cxx11::string::~string(local_2bb0);
  } while (local_2bb0 != local_12a8);
  std::allocator<char>::~allocator((allocator<char> *)&local_12b4);
  std::allocator<char>::~allocator((allocator<char> *)&local_12b3);
  std::allocator<char>::~allocator((allocator<char> *)&local_12b2);
  std::allocator<char>::~allocator((allocator<char> *)&local_12b1);
  std::allocator<char>::~allocator((allocator<char> *)&local_1211);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_12f0,"mul_div",&local_12f1);
  local_1397 = 1;
  local_1395 = 1;
  local_1390 = local_1388;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1388,"mul_div",&local_1391);
  local_1390 = local_1368;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1368,"/",&local_1392);
  local_1390 = local_1348;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1348,"S?",&local_1393);
  local_1390 = local_1328;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1328,"pow",&local_1394);
  local_1395 = 0;
  local_1308 = (iterator)local_1388;
  local_1300 = 4;
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator(&local_1396);
  __l_09._M_len = local_1300;
  __l_09._M_array = local_1308;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_12f0.rhs,__l_09,&local_1396);
  local_1397 = 0;
  pvVar1 = std::
           vector<Omega_h::Language::Production,_std::allocator<Omega_h::Language::Production>_>::
           operator[](local_20,0x1a);
  Language::Production::operator=(pvVar1,&local_12f0);
  Language::Production::~Production(&local_12f0);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator(&local_1396);
  local_2c28 = (string *)&local_1308;
  do {
    local_2c28 = local_2c28 + -0x20;
    std::__cxx11::string::~string(local_2c28);
  } while (local_2c28 != local_1388);
  std::allocator<char>::~allocator((allocator<char> *)&local_1394);
  std::allocator<char>::~allocator((allocator<char> *)&local_1393);
  std::allocator<char>::~allocator((allocator<char> *)&local_1392);
  std::allocator<char>::~allocator((allocator<char> *)&local_1391);
  std::allocator<char>::~allocator((allocator<char> *)&local_12f1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_13d0,"pow",&local_13d1);
  local_1477 = 1;
  local_1475 = 1;
  local_1470 = local_1468;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1468,"scalar",&local_1471);
  local_1470 = local_1448;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1448,"^",&local_1472);
  local_1470 = local_1428;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1428,"S?",&local_1473);
  local_1470 = local_1408;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1408,"pow",&local_1474);
  local_1475 = 0;
  local_13e8 = (iterator)local_1468;
  local_13e0 = 4;
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator(&local_1476);
  __l_08._M_len = local_13e0;
  __l_08._M_array = local_13e8;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_13d0.rhs,__l_08,&local_1476);
  local_1477 = 0;
  pvVar1 = std::
           vector<Omega_h::Language::Production,_std::allocator<Omega_h::Language::Production>_>::
           operator[](local_20,0x1b);
  Language::Production::operator=(pvVar1,&local_13d0);
  Language::Production::~Production(&local_13d0);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator(&local_1476);
  local_2ca0 = (string *)&local_13e8;
  do {
    local_2ca0 = local_2ca0 + -0x20;
    std::__cxx11::string::~string(local_2ca0);
  } while (local_2ca0 != local_1468);
  std::allocator<char>::~allocator((allocator<char> *)&local_1474);
  std::allocator<char>::~allocator((allocator<char> *)&local_1473);
  std::allocator<char>::~allocator((allocator<char> *)&local_1472);
  std::allocator<char>::~allocator((allocator<char> *)&local_1471);
  std::allocator<char>::~allocator((allocator<char> *)&local_13d1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_14b0,"scalar",&local_14b1);
  local_15ba = 1;
  local_15b8 = 1;
  local_15b0 = local_15a8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_15a8,"name",&local_15b1);
  local_15b0 = local_1588;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1588,"S?",&local_15b2);
  local_15b0 = local_1568;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1568,"(",&local_15b3);
  local_15b0 = local_1548;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1548,"S?",&local_15b4);
  local_15b0 = local_1528;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1528,"args?",&local_15b5);
  local_15b0 = local_1508;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1508,")",&local_15b6);
  local_15b0 = local_14e8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_14e8,"S?",&local_15b7);
  local_15b8 = 0;
  local_14c8 = (iterator)local_15a8;
  local_14c0 = 7;
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator(&local_15b9);
  __l_07._M_len = local_14c0;
  __l_07._M_array = local_14c8;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_14b0.rhs,__l_07,&local_15b9);
  local_15ba = 0;
  pvVar1 = std::
           vector<Omega_h::Language::Production,_std::allocator<Omega_h::Language::Production>_>::
           operator[](local_20,0x1c);
  Language::Production::operator=(pvVar1,&local_14b0);
  Language::Production::~Production(&local_14b0);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator(&local_15b9);
  local_2d48 = (string *)&local_14c8;
  do {
    local_2d48 = local_2d48 + -0x20;
    std::__cxx11::string::~string(local_2d48);
  } while (local_2d48 != local_15a8);
  std::allocator<char>::~allocator((allocator<char> *)&local_15b7);
  std::allocator<char>::~allocator((allocator<char> *)&local_15b6);
  std::allocator<char>::~allocator((allocator<char> *)&local_15b5);
  std::allocator<char>::~allocator((allocator<char> *)&local_15b4);
  std::allocator<char>::~allocator((allocator<char> *)&local_15b3);
  std::allocator<char>::~allocator((allocator<char> *)&local_15b2);
  std::allocator<char>::~allocator((allocator<char> *)&local_15b1);
  std::allocator<char>::~allocator((allocator<char> *)&local_14b1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_15f8,"args?",&local_15f9);
  local_15f8.rhs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_15f8.rhs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_15f8.rhs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_15f8.rhs);
  pvVar1 = std::
           vector<Omega_h::Language::Production,_std::allocator<Omega_h::Language::Production>_>::
           operator[](local_20,0x1d);
  Language::Production::operator=(pvVar1,&local_15f8);
  Language::Production::~Production(&local_15f8);
  std::allocator<char>::~allocator((allocator<char> *)&local_15f9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1638,"args?",&local_1639);
  local_167c = 1;
  local_167a = 1;
  local_1678 = local_1670;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1670,"args",&local_1679);
  local_167a = 0;
  local_1650 = (iterator)local_1670;
  local_1648 = 1;
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator(&local_167b);
  __l_06._M_len = local_1648;
  __l_06._M_array = local_1650;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_1638.rhs,__l_06,&local_167b);
  local_167c = 0;
  pvVar1 = std::
           vector<Omega_h::Language::Production,_std::allocator<Omega_h::Language::Production>_>::
           operator[](local_20,0x1e);
  Language::Production::operator=(pvVar1,&local_1638);
  Language::Production::~Production(&local_1638);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator(&local_167b);
  local_2da0 = (string *)&local_1650;
  do {
    local_2da0 = local_2da0 + -0x20;
    std::__cxx11::string::~string(local_2da0);
  } while (local_2da0 != local_1670);
  std::allocator<char>::~allocator((allocator<char> *)&local_1679);
  std::allocator<char>::~allocator((allocator<char> *)&local_1639);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_16b8,"args",&local_16b9);
  local_16fc = 1;
  local_16fa = 1;
  local_16f8 = local_16f0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_16f0,"ternary",&local_16f9);
  local_16fa = 0;
  local_16d0 = (iterator)local_16f0;
  local_16c8 = 1;
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator(&local_16fb);
  __l_05._M_len = local_16c8;
  __l_05._M_array = local_16d0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_16b8.rhs,__l_05,&local_16fb);
  local_16fc = 0;
  pvVar1 = std::
           vector<Omega_h::Language::Production,_std::allocator<Omega_h::Language::Production>_>::
           operator[](local_20,0x1f);
  Language::Production::operator=(pvVar1,&local_16b8);
  Language::Production::~Production(&local_16b8);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator(&local_16fb);
  local_2de8 = (string *)&local_16d0;
  do {
    local_2de8 = local_2de8 + -0x20;
    std::__cxx11::string::~string(local_2de8);
  } while (local_2de8 != local_16f0);
  std::allocator<char>::~allocator((allocator<char> *)&local_16f9);
  std::allocator<char>::~allocator((allocator<char> *)&local_16b9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1738,"args",&local_1739);
  local_17df = 1;
  local_17dd = 1;
  local_17d8 = local_17d0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_17d0,"args",&local_17d9);
  local_17d8 = local_17b0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_17b0,",",&local_17da);
  local_17d8 = local_1790;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1790,"S?",&local_17db);
  local_17d8 = local_1770;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1770,"ternary",&local_17dc);
  local_17dd = 0;
  local_1750 = (iterator)local_17d0;
  local_1748 = 4;
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator(&local_17de);
  __l_04._M_len = local_1748;
  __l_04._M_array = local_1750;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_1738.rhs,__l_04,&local_17de);
  local_17df = 0;
  pvVar1 = std::
           vector<Omega_h::Language::Production,_std::allocator<Omega_h::Language::Production>_>::
           operator[](local_20,0x20);
  Language::Production::operator=(pvVar1,&local_1738);
  Language::Production::~Production(&local_1738);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator(&local_17de);
  local_2e60 = (string *)&local_1750;
  do {
    local_2e60 = local_2e60 + -0x20;
    std::__cxx11::string::~string(local_2e60);
  } while (local_2e60 != local_17d0);
  std::allocator<char>::~allocator((allocator<char> *)&local_17dc);
  std::allocator<char>::~allocator((allocator<char> *)&local_17db);
  std::allocator<char>::~allocator((allocator<char> *)&local_17da);
  std::allocator<char>::~allocator((allocator<char> *)&local_17d9);
  std::allocator<char>::~allocator((allocator<char> *)&local_1739);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1818,"neg",&local_1819);
  local_189e = 1;
  local_189c = 1;
  local_1898 = local_1890;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1890,"-",&local_1899);
  local_1898 = local_1870;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1870,"S?",&local_189a);
  local_1898 = local_1850;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1850,"neg",&local_189b);
  local_189c = 0;
  local_1830 = (iterator)local_1890;
  local_1828 = 3;
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator(&local_189d);
  __l_03._M_len = local_1828;
  __l_03._M_array = local_1830;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_1818.rhs,__l_03,&local_189d);
  local_189e = 0;
  pvVar1 = std::
           vector<Omega_h::Language::Production,_std::allocator<Omega_h::Language::Production>_>::
           operator[](local_20,0x21);
  Language::Production::operator=(pvVar1,&local_1818);
  Language::Production::~Production(&local_1818);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator(&local_189d);
  local_2ec8 = (string *)&local_1830;
  do {
    local_2ec8 = local_2ec8 + -0x20;
    std::__cxx11::string::~string(local_2ec8);
  } while (local_2ec8 != local_1890);
  std::allocator<char>::~allocator((allocator<char> *)&local_189b);
  std::allocator<char>::~allocator((allocator<char> *)&local_189a);
  std::allocator<char>::~allocator((allocator<char> *)&local_1899);
  std::allocator<char>::~allocator((allocator<char> *)&local_1819);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_18d8,"scalar",&local_18d9);
  local_19a0 = 1;
  local_199e = 1;
  local_1998 = local_1990;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1990,"(",&local_1999);
  local_1998 = local_1970;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1970,"S?",&local_199a);
  local_1998 = local_1950;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1950,"ternary",&local_199b);
  local_1998 = local_1930;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1930,")",&local_199c);
  local_1998 = local_1910;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1910,"S?",&local_199d);
  local_199e = 0;
  local_18f0 = (iterator)local_1990;
  local_18e8 = 5;
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator(&local_199f);
  __l_02._M_len = local_18e8;
  __l_02._M_array = local_18f0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_18d8.rhs,__l_02,&local_199f);
  local_19a0 = 0;
  pvVar1 = std::
           vector<Omega_h::Language::Production,_std::allocator<Omega_h::Language::Production>_>::
           operator[](local_20,0x22);
  Language::Production::operator=(pvVar1,&local_18d8);
  Language::Production::~Production(&local_18d8);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator(&local_199f);
  local_2f50 = (string *)&local_18f0;
  do {
    local_2f50 = local_2f50 + -0x20;
    std::__cxx11::string::~string(local_2f50);
  } while (local_2f50 != local_1990);
  std::allocator<char>::~allocator((allocator<char> *)&local_199d);
  std::allocator<char>::~allocator((allocator<char> *)&local_199c);
  std::allocator<char>::~allocator((allocator<char> *)&local_199b);
  std::allocator<char>::~allocator((allocator<char> *)&local_199a);
  std::allocator<char>::~allocator((allocator<char> *)&local_1999);
  std::allocator<char>::~allocator((allocator<char> *)&local_18d9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_19d8,"scalar",&local_19d9);
  local_1a3d = 1;
  local_1a3b = 1;
  local_1a38 = local_1a30;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1a30,"constant",&local_1a39);
  local_1a38 = local_1a10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1a10,"S?",&local_1a3a);
  local_1a3b = 0;
  local_19f0 = (iterator)local_1a30;
  local_19e8 = 2;
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator(&local_1a3c);
  __l_01._M_len = local_19e8;
  __l_01._M_array = local_19f0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_19d8.rhs,__l_01,&local_1a3c);
  local_1a3d = 0;
  pvVar1 = std::
           vector<Omega_h::Language::Production,_std::allocator<Omega_h::Language::Production>_>::
           operator[](local_20,0x23);
  Language::Production::operator=(pvVar1,&local_19d8);
  Language::Production::~Production(&local_19d8);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator(&local_1a3c);
  local_2fa8 = (string *)&local_19f0;
  do {
    local_2fa8 = local_2fa8 + -0x20;
    std::__cxx11::string::~string(local_2fa8);
  } while (local_2fa8 != local_1a30);
  std::allocator<char>::~allocator((allocator<char> *)&local_1a3a);
  std::allocator<char>::~allocator((allocator<char> *)&local_1a39);
  std::allocator<char>::~allocator((allocator<char> *)&local_19d9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1a78,"scalar",&local_1a79);
  local_1add = 1;
  local_1adb = 1;
  local_1ad8 = local_1ad0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1ad0,"name",&local_1ad9);
  local_1ad8 = local_1ab0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1ab0,"S?",&local_1ada);
  local_1adb = 0;
  local_1a90 = (iterator)local_1ad0;
  local_1a88 = 2;
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator(&local_1adc);
  __l_00._M_len = local_1a88;
  __l_00._M_array = local_1a90;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_1a78.rhs,__l_00,&local_1adc);
  local_1add = 0;
  pvVar1 = std::
           vector<Omega_h::Language::Production,_std::allocator<Omega_h::Language::Production>_>::
           operator[](local_20,0x24);
  Language::Production::operator=(pvVar1,&local_1a78);
  Language::Production::~Production(&local_1a78);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator(&local_1adc);
  local_3000 = (string *)&local_1a90;
  do {
    local_3000 = local_3000 + -0x20;
    std::__cxx11::string::~string(local_3000);
  } while (local_3000 != local_1ad0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1ada);
  std::allocator<char>::~allocator((allocator<char> *)&local_1ad9);
  std::allocator<char>::~allocator((allocator<char> *)&local_1a79);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1b18,"S?",&local_1b19);
  local_1b18.rhs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1b18.rhs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1b18.rhs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_1b18.rhs);
  pvVar1 = std::
           vector<Omega_h::Language::Production,_std::allocator<Omega_h::Language::Production>_>::
           operator[](local_20,0x25);
  Language::Production::operator=(pvVar1,&local_1b18);
  Language::Production::~Production(&local_1b18);
  std::allocator<char>::~allocator((allocator<char> *)&local_1b19);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1b58,"S?",&local_1b59);
  local_1b9c = 1;
  local_1b9a = 1;
  local_1b98 = local_1b90;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1b90,"spaces",&local_1b99);
  local_1b9a = 0;
  local_1b70 = (iterator)local_1b90;
  local_1b68 = 1;
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator(&local_1b9b);
  __l._M_len = local_1b68;
  __l._M_array = local_1b70;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_1b58.rhs,__l,&local_1b9b);
  local_1b9c = 0;
  pvVar1 = std::
           vector<Omega_h::Language::Production,_std::allocator<Omega_h::Language::Production>_>::
           operator[](local_20,0x26);
  Language::Production::operator=(pvVar1,&local_1b58);
  Language::Production::~Production(&local_1b58);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator(&local_1b9b);
  local_3058 = (string *)&local_1b70;
  do {
    local_3058 = local_3058 + -0x20;
    std::__cxx11::string::~string(local_3058);
  } while (local_3058 != local_1b90);
  std::allocator<char>::~allocator((allocator<char> *)&local_1b99);
  std::allocator<char>::~allocator((allocator<char> *)&local_1b59);
  std::vector<Omega_h::Language::Token,_std::allocator<Omega_h::Language::Token>_>::resize
            (&in_RDI->tokens,0x16);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1be0,"spaces",&local_1be1);
  local_1be3 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1be0.regex,"[ \t\n\r]+",&local_1be2);
  local_1be3 = 0;
  pvVar2 = std::vector<Omega_h::Language::Token,_std::allocator<Omega_h::Language::Token>_>::
           operator[](&in_RDI->tokens,0);
  Language::Token::operator=(pvVar2,&local_1be0);
  Language::Token::~Token(&local_1be0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1be2);
  std::allocator<char>::~allocator((allocator<char> *)&local_1be1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1c28,"name",&local_1c29);
  local_1c2b = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1c28.regex,"[_a-zA-Z][_a-zA-Z0-9]*",&local_1c2a);
  local_1c2b = 0;
  pvVar2 = std::vector<Omega_h::Language::Token,_std::allocator<Omega_h::Language::Token>_>::
           operator[](&in_RDI->tokens,1);
  Language::Token::operator=(pvVar2,&local_1c28);
  Language::Token::~Token(&local_1c28);
  std::allocator<char>::~allocator((allocator<char> *)&local_1c2a);
  std::allocator<char>::~allocator((allocator<char> *)&local_1c29);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1c70,"+",&local_1c71);
  local_1c73 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1c70.regex,"\\+",&local_1c72);
  local_1c73 = 0;
  pvVar2 = std::vector<Omega_h::Language::Token,_std::allocator<Omega_h::Language::Token>_>::
           operator[](&in_RDI->tokens,2);
  Language::Token::operator=(pvVar2,&local_1c70);
  Language::Token::~Token(&local_1c70);
  std::allocator<char>::~allocator((allocator<char> *)&local_1c72);
  std::allocator<char>::~allocator((allocator<char> *)&local_1c71);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1cb8,"-",&local_1cb9);
  local_1cbb = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1cb8.regex,"\\-",&local_1cba);
  local_1cbb = 0;
  pvVar2 = std::vector<Omega_h::Language::Token,_std::allocator<Omega_h::Language::Token>_>::
           operator[](&in_RDI->tokens,3);
  Language::Token::operator=(pvVar2,&local_1cb8);
  Language::Token::~Token(&local_1cb8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1cba);
  std::allocator<char>::~allocator((allocator<char> *)&local_1cb9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1d00,"*",&local_1d01);
  local_1d03 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1d00.regex,"\\*",&local_1d02);
  local_1d03 = 0;
  pvVar2 = std::vector<Omega_h::Language::Token,_std::allocator<Omega_h::Language::Token>_>::
           operator[](&in_RDI->tokens,4);
  Language::Token::operator=(pvVar2,&local_1d00);
  Language::Token::~Token(&local_1d00);
  std::allocator<char>::~allocator((allocator<char> *)&local_1d02);
  std::allocator<char>::~allocator((allocator<char> *)&local_1d01);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1d48,"/",&local_1d49);
  local_1d4b = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1d48.regex,"\\/",&local_1d4a);
  local_1d4b = 0;
  pvVar2 = std::vector<Omega_h::Language::Token,_std::allocator<Omega_h::Language::Token>_>::
           operator[](&in_RDI->tokens,5);
  Language::Token::operator=(pvVar2,&local_1d48);
  Language::Token::~Token(&local_1d48);
  std::allocator<char>::~allocator((allocator<char> *)&local_1d4a);
  std::allocator<char>::~allocator((allocator<char> *)&local_1d49);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1d90,"^",&local_1d91);
  local_1d93 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1d90.regex,"\\^",&local_1d92);
  local_1d93 = 0;
  pvVar2 = std::vector<Omega_h::Language::Token,_std::allocator<Omega_h::Language::Token>_>::
           operator[](&in_RDI->tokens,6);
  Language::Token::operator=(pvVar2,&local_1d90);
  Language::Token::~Token(&local_1d90);
  std::allocator<char>::~allocator((allocator<char> *)&local_1d92);
  std::allocator<char>::~allocator((allocator<char> *)&local_1d91);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1dd8,"(",&local_1dd9);
  local_1ddb = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1dd8.regex,"\\(",&local_1dda);
  local_1ddb = 0;
  pvVar2 = std::vector<Omega_h::Language::Token,_std::allocator<Omega_h::Language::Token>_>::
           operator[](&in_RDI->tokens,7);
  Language::Token::operator=(pvVar2,&local_1dd8);
  Language::Token::~Token(&local_1dd8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1dda);
  std::allocator<char>::~allocator((allocator<char> *)&local_1dd9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1e20,")",&local_1e21);
  local_1e23 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1e20.regex,"\\)",&local_1e22);
  local_1e23 = 0;
  pvVar2 = std::vector<Omega_h::Language::Token,_std::allocator<Omega_h::Language::Token>_>::
           operator[](&in_RDI->tokens,8);
  Language::Token::operator=(pvVar2,&local_1e20);
  Language::Token::~Token(&local_1e20);
  std::allocator<char>::~allocator((allocator<char> *)&local_1e22);
  std::allocator<char>::~allocator((allocator<char> *)&local_1e21);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1e68,",",&local_1e69);
  local_1e6b = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1e68.regex,",",&local_1e6a);
  local_1e6b = 0;
  pvVar2 = std::vector<Omega_h::Language::Token,_std::allocator<Omega_h::Language::Token>_>::
           operator[](&in_RDI->tokens,9);
  Language::Token::operator=(pvVar2,&local_1e68);
  Language::Token::~Token(&local_1e68);
  std::allocator<char>::~allocator((allocator<char> *)&local_1e6a);
  std::allocator<char>::~allocator((allocator<char> *)&local_1e69);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1eb0,"?",&local_1eb1);
  local_1eb3 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1eb0.regex,"\\?",&local_1eb2);
  local_1eb3 = 0;
  pvVar2 = std::vector<Omega_h::Language::Token,_std::allocator<Omega_h::Language::Token>_>::
           operator[](&in_RDI->tokens,10);
  Language::Token::operator=(pvVar2,&local_1eb0);
  Language::Token::~Token(&local_1eb0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1eb2);
  std::allocator<char>::~allocator((allocator<char> *)&local_1eb1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1ef8,":",&local_1ef9);
  local_1efb = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1ef8.regex,":",&local_1efa);
  local_1efb = 0;
  pvVar2 = std::vector<Omega_h::Language::Token,_std::allocator<Omega_h::Language::Token>_>::
           operator[](&in_RDI->tokens,0xb);
  Language::Token::operator=(pvVar2,&local_1ef8);
  Language::Token::~Token(&local_1ef8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1efa);
  std::allocator<char>::~allocator((allocator<char> *)&local_1ef9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1f40,">",&local_1f41);
  local_1f43 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1f40.regex,">",&local_1f42);
  local_1f43 = 0;
  pvVar2 = std::vector<Omega_h::Language::Token,_std::allocator<Omega_h::Language::Token>_>::
           operator[](&in_RDI->tokens,0xc);
  Language::Token::operator=(pvVar2,&local_1f40);
  Language::Token::~Token(&local_1f40);
  std::allocator<char>::~allocator((allocator<char> *)&local_1f42);
  std::allocator<char>::~allocator((allocator<char> *)&local_1f41);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1f88,"<",&local_1f89);
  local_1f8b = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1f88.regex,"<",&local_1f8a);
  local_1f8b = 0;
  pvVar2 = std::vector<Omega_h::Language::Token,_std::allocator<Omega_h::Language::Token>_>::
           operator[](&in_RDI->tokens,0xd);
  Language::Token::operator=(pvVar2,&local_1f88);
  Language::Token::~Token(&local_1f88);
  std::allocator<char>::~allocator((allocator<char> *)&local_1f8a);
  std::allocator<char>::~allocator((allocator<char> *)&local_1f89);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1fd0,">=",&local_1fd1);
  local_1fd3 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1fd0.regex,">=",&local_1fd2);
  local_1fd3 = 0;
  pvVar2 = std::vector<Omega_h::Language::Token,_std::allocator<Omega_h::Language::Token>_>::
           operator[](&in_RDI->tokens,0xe);
  Language::Token::operator=(pvVar2,&local_1fd0);
  Language::Token::~Token(&local_1fd0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1fd2);
  std::allocator<char>::~allocator((allocator<char> *)&local_1fd1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_2018,"<=",&local_2019);
  local_201b = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_2018.regex,"<=",&local_201a);
  local_201b = 0;
  pvVar2 = std::vector<Omega_h::Language::Token,_std::allocator<Omega_h::Language::Token>_>::
           operator[](&in_RDI->tokens,0xf);
  Language::Token::operator=(pvVar2,&local_2018);
  Language::Token::~Token(&local_2018);
  std::allocator<char>::~allocator((allocator<char> *)&local_201a);
  std::allocator<char>::~allocator((allocator<char> *)&local_2019);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_2060,"==",&local_2061);
  local_2063 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_2060.regex,"==",&local_2062);
  local_2063 = 0;
  pvVar2 = std::vector<Omega_h::Language::Token,_std::allocator<Omega_h::Language::Token>_>::
           operator[](&in_RDI->tokens,0x10);
  Language::Token::operator=(pvVar2,&local_2060);
  Language::Token::~Token(&local_2060);
  std::allocator<char>::~allocator((allocator<char> *)&local_2062);
  std::allocator<char>::~allocator((allocator<char> *)&local_2061);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_20a8,"&&",&local_20a9);
  local_20ab = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_20a8.regex,"&&",&local_20aa);
  local_20ab = 0;
  pvVar2 = std::vector<Omega_h::Language::Token,_std::allocator<Omega_h::Language::Token>_>::
           operator[](&in_RDI->tokens,0x11);
  Language::Token::operator=(pvVar2,&local_20a8);
  Language::Token::~Token(&local_20a8);
  std::allocator<char>::~allocator((allocator<char> *)&local_20aa);
  std::allocator<char>::~allocator((allocator<char> *)&local_20a9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_20f0,"||",&local_20f1);
  local_20f3 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_20f0.regex,"\\|\\|",&local_20f2);
  local_20f3 = 0;
  pvVar2 = std::vector<Omega_h::Language::Token,_std::allocator<Omega_h::Language::Token>_>::
           operator[](&in_RDI->tokens,0x12);
  Language::Token::operator=(pvVar2,&local_20f0);
  Language::Token::~Token(&local_20f0);
  std::allocator<char>::~allocator((allocator<char> *)&local_20f2);
  std::allocator<char>::~allocator((allocator<char> *)&local_20f1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_2138,"constant",&local_2139);
  local_213b = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_2138.regex,"(0|([1-9][0-9]*))(\\.[0-9]*)?([eE][\\-\\+]?[0-9]+)?",
             &local_213a);
  local_213b = 0;
  pvVar2 = std::vector<Omega_h::Language::Token,_std::allocator<Omega_h::Language::Token>_>::
           operator[](&in_RDI->tokens,0x13);
  Language::Token::operator=(pvVar2,&local_2138);
  Language::Token::~Token(&local_2138);
  std::allocator<char>::~allocator((allocator<char> *)&local_213a);
  std::allocator<char>::~allocator((allocator<char> *)&local_2139);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_2180,";",&local_2181);
  local_2183 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_2180.regex,";",&local_2182);
  local_2183 = 0;
  pvVar2 = std::vector<Omega_h::Language::Token,_std::allocator<Omega_h::Language::Token>_>::
           operator[](&in_RDI->tokens,0x14);
  Language::Token::operator=(pvVar2,&local_2180);
  Language::Token::~Token(&local_2180);
  std::allocator<char>::~allocator((allocator<char> *)&local_2182);
  std::allocator<char>::~allocator((allocator<char> *)&local_2181);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_21c8,"=",&local_21c9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_21c8.regex,"=",&local_21ca);
  pvVar2 = std::vector<Omega_h::Language::Token,_std::allocator<Omega_h::Language::Token>_>::
           operator[](&in_RDI->tokens,0x15);
  Language::Token::operator=(pvVar2,&local_21c8);
  Language::Token::~Token(&local_21c8);
  std::allocator<char>::~allocator((allocator<char> *)&local_21ca);
  std::allocator<char>::~allocator((allocator<char> *)&local_21c9);
  return in_RDI;
}

Assistant:

Language build_language() {
  Language out;
  auto& prods = out.productions;
  prods.resize(NPRODS);
  prods[PROD_PROGRAM] = {"program", {"statements", "expr?"}};
  prods[PROD_NO_STATEMENTS] = {"statements", {}};
  prods[PROD_NEXT_STATEMENT] = {
      "statements", {"statements", "statement", ";", "S?"}};
  prods[PROD_ASSIGN] = {"statement", {"name", "S?", "=", "S?", "expr"}};
  prods[PROD_NO_EXPR] = {"expr?", {}};
  prods[PROD_YES_EXPR] = {"expr?", {"expr"}};
  prods[PROD_EXPR] = {"expr", {"ternary"}};
  prods[PROD_TERNARY_DECAY] = {"ternary", {"add_sub"}};
  prods[PROD_OR_DECAY] = {"or", {"and"}};
  prods[PROD_AND_DECAY] = {"and", {"comp"}};
  prods[PROD_ADD_SUB_DECAY] = {"add_sub", {"mul_div"}};
  prods[PROD_MUL_DIV_DECAY] = {"mul_div", {"neg"}};
  prods[PROD_NEG_DECAY] = {"neg", {"pow"}};
  prods[PROD_POW_DECAY] = {"pow", {"scalar"}};
  prods[PROD_TERNARY] = {
      "ternary", {"or", "?", "S?", "add_sub", ":", "S?", "add_sub"}};
  prods[PROD_OR] = {"or", {"or", "||", "S?", "and"}};
  prods[PROD_AND] = {"and", {"and", "&&", "S?", "comp"}};
  prods[PROD_GT] = {"comp", {"add_sub", ">", "S?", "add_sub"}};
  prods[PROD_LT] = {"comp", {"add_sub", "<", "S?", "add_sub"}};
  prods[PROD_GEQ] = {"comp", {"add_sub", ">=", "S?", "add_sub"}};
  prods[PROD_LEQ] = {"comp", {"add_sub", "<=", "S?", "add_sub"}};
  prods[PROD_EQ] = {"comp", {"add_sub", "==", "S?", "add_sub"}};
  prods[PROD_BOOL_PARENS] = {"comp", {"(", "S?", "or", ")", "S?"}};
  prods[PROD_ADD] = {"add_sub", {"add_sub", "+", "S?", "mul_div"}};
  prods[PROD_SUB] = {"add_sub", {"add_sub", "-", "S?", "mul_div"}};
  prods[PROD_MUL] = {"mul_div", {"mul_div", "*", "S?", "pow"}};
  prods[PROD_DIV] = {"mul_div", {"mul_div", "/", "S?", "pow"}};
  prods[PROD_POW] = {"pow", {"scalar", "^", "S?", "pow"}};
  prods[PROD_CALL] = {"scalar", {"name", "S?", "(", "S?", "args?", ")", "S?"}};
  prods[PROD_NO_ARGS] = {"args?", {}};
  prods[PROD_SOME_ARGS] = {"args?", {"args"}};
  prods[PROD_FIRST_ARG] = {"args", {"ternary"}};
  prods[PROD_NEXT_ARG] = {"args", {"args", ",", "S?", "ternary"}};
  prods[PROD_NEG] = {"neg", {"-", "S?", "neg"}};
  prods[PROD_VAL_PARENS] = {"scalar", {"(", "S?", "ternary", ")", "S?"}};
  prods[PROD_CONST] = {"scalar", {"constant", "S?"}};
  prods[PROD_VAR] = {"scalar", {"name", "S?"}};
  prods[PROD_NO_SPACES] = {"S?", {}};
  prods[PROD_SPACES] = {"S?", {"spaces"}};
  out.tokens.resize(NTOKS);
  out.tokens[TOK_SPACE] = {"spaces", "[ \t\n\r]+"};
  out.tokens[TOK_NAME] = {"name", "[_a-zA-Z][_a-zA-Z0-9]*"};
  out.tokens[TOK_ADD] = {"+", "\\+"};
  out.tokens[TOK_SUB] = {"-", "\\-"};
  out.tokens[TOK_MUL] = {"*", "\\*"};
  out.tokens[TOK_DIV] = {"/", "\\/"};
  out.tokens[TOK_POW] = {"^", "\\^"};
  out.tokens[TOK_LPAREN] = {"(", "\\("};
  out.tokens[TOK_RPAREN] = {")", "\\)"};
  out.tokens[TOK_COMMA] = {",", ","};
  out.tokens[TOK_CHECK] = {"?", "\\?"};
  out.tokens[TOK_CHOOSE] = {":", ":"};
  out.tokens[TOK_GT] = {">", ">"};
  out.tokens[TOK_LT] = {"<", "<"};
  out.tokens[TOK_GEQ] = {">=", ">="};
  out.tokens[TOK_LEQ] = {"<=", "<="};
  out.tokens[TOK_EQ] = {"==", "=="};
  out.tokens[TOK_AND] = {"&&", "&&"};
  out.tokens[TOK_OR] = {"||", "\\|\\|"};
  out.tokens[TOK_CONST] = {
      "constant", "(0|([1-9][0-9]*))(\\.[0-9]*)?([eE][\\-\\+]?[0-9]+)?"};
  out.tokens[TOK_SEMICOLON] = {";", ";"};
  out.tokens[TOK_ASSIGN] = {"=", "="};
  return out;
}